

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# That.hpp
# Opt level: O1

void ut11::Assert::That<char[16],ut11::Operands::IsStringBeginningWith>
               (size_t line,string *file,char (*expected) [16],IsStringBeginningWith *operand)

{
  ulong uVar1;
  pointer pcVar2;
  int iVar3;
  size_t sVar4;
  bool bVar5;
  string local_b8;
  size_t local_98;
  string local_90;
  string local_70;
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  sVar4 = strlen(*expected);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,expected,*expected + sVar4);
  uVar1 = (operand->m_expected)._M_string_length;
  local_98 = line;
  if (uVar1 <= local_b8._M_string_length) {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_b8);
    if (local_48 == (operand->m_expected)._M_string_length) {
      if (local_48 == 0) {
        bVar5 = true;
      }
      else {
        iVar3 = bcmp(local_50,(operand->m_expected)._M_dataplus._M_p,local_48);
        bVar5 = iVar3 == 0;
      }
      goto LAB_00200d9d;
    }
  }
  bVar5 = false;
LAB_00200d9d:
  if ((uVar1 <= local_b8._M_string_length) && (local_50 != local_40)) {
    operator_delete(local_50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if (!bVar5) {
    pcVar2 = (file->_M_dataplus)._M_p;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar2,pcVar2 + file->_M_string_length);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    sVar4 = strlen(*expected);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,expected,*expected + sVar4);
    Operands::IsStringBeginningWith::GetErrorMessage(&local_70,operand,&local_b8);
    Fail(local_98,&local_90,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

inline void That(std::size_t line, std::string file, const Expected& expected, const Operand& operand)
		{
			if ( operand(expected) )
				return;
			Fail(line, file, operand.GetErrorMessage(expected));
		}